

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O2

void reset_entrance_data(chunk *c)

{
  ushort uVar1;
  int **ppiVar2;
  int *piVar3;
  long lVar4;
  dun_data *pdVar5;
  ulong uVar6;
  long lVar7;
  
  pdVar5 = dun;
  uVar1 = z_info->level_room_max;
  for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
    pdVar5->ent_n[uVar6] = 0;
  }
  ppiVar2 = pdVar5->ent2room;
  if (ppiVar2 != (int **)0x0) {
    lVar7 = 0;
    while (*(void **)((long)ppiVar2 + lVar7) != (void *)0x0) {
      mem_free(*(void **)((long)ppiVar2 + lVar7));
      lVar7 = lVar7 + 8;
      ppiVar2 = dun->ent2room;
    }
    mem_free(ppiVar2);
  }
  ppiVar2 = (int **)mem_alloc((long)c->height * 8 + 8);
  pdVar5 = dun;
  dun->ent2room = ppiVar2;
  for (lVar7 = 0; lVar7 < c->height; lVar7 = lVar7 + 1) {
    piVar3 = (int *)mem_alloc((long)c->width << 2);
    dun->ent2room[lVar7] = piVar3;
    pdVar5 = dun;
    for (lVar4 = 0; lVar4 < c->width; lVar4 = lVar4 + 1) {
      pdVar5->ent2room[lVar7][lVar4] = -1;
    }
  }
  pdVar5->ent2room[c->height] = (int *)0x0;
  return;
}

Assistant:

static void reset_entrance_data(const struct chunk *c)
{
	int i;

	for (i = 0; i < z_info->level_room_max; ++i) {
		dun->ent_n[i] = 0;
	}
	if (dun->ent2room) {
		for (i = 0; dun->ent2room[i]; ++i) {
			mem_free(dun->ent2room[i]);
		}
		mem_free(dun->ent2room);
	}
	/* Add a trailing NULL so the deallocation knows when to stop. */
	dun->ent2room = mem_alloc((c->height + 1) * sizeof(*dun->ent2room));
	for (i = 0; i < c->height; ++i) {
		int j;

		dun->ent2room[i] =
			mem_alloc(c->width * sizeof(*dun->ent2room[i]));
		for (j = 0; j < c->width; ++j) {
			dun->ent2room[i][j] = -1;
		}
	}
	dun->ent2room[c->height] = NULL;
}